

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_monitor.cpp
# Opt level: O2

void __thiscall
r_exec::PMonitor::PMonitor
          (PMonitor *this,MDLController *controller,BindingMap *bindings,Fact *prediction,
          bool rate_failures)

{
  Pred *this_00;
  _Fact *reference_fact;
  MonitoringJob<r_exec::PMonitor> *this_01;
  uint64_t uVar1;
  long lVar2;
  _Mem *this_02;
  
  Monitor::Monitor(&this->super_Monitor,controller,bindings,prediction);
  (this->super_Monitor).super__Object._vptr__Object = (_func_int **)&PTR__PMonitor_001d2b68;
  this->rate_failures = rate_failures;
  this_00 = _Fact::get_pred(&prediction->super__Fact);
  reference_fact = Pred::get_target(this_00);
  this->prediction_target = reference_fact;
  BindingMap::reset_fwd_timings(bindings,reference_fact);
  this_01 = (MonitoringJob<r_exec::PMonitor> *)operator_new(0x28);
  uVar1 = _Fact::get_before(this->prediction_target);
  lVar2 = r_code::Utils::GetTimeTolerance();
  MonitoringJob<r_exec::PMonitor>::MonitoringJob(this_01,this,lVar2 + uVar1);
  this_02 = (_Mem *)r_code::Mem::Get();
  _Mem::pushTimeJob(this_02,(TimeJob *)this_01);
  return;
}

Assistant:

PMonitor::PMonitor(MDLController *controller,
                   BindingMap *bindings,
                   Fact *prediction,
                   bool rate_failures): Monitor(controller, bindings, prediction), rate_failures(rate_failures)   // prediction is f0->pred->f1->obj; not simulated.
{
    prediction_target = prediction->get_pred()->get_target(); // f1.
    bindings->reset_fwd_timings(prediction_target);
    MonitoringJob<PMonitor> *j = new MonitoringJob<PMonitor>(this, prediction_target->get_before() + Utils::GetTimeTolerance());
    _Mem::Get()->pushTimeJob(j);
}